

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rfc5444_reader_dropcontext.c
# Opt level: O0

rfc5444_result cb_start_packet(rfc5444_reader_tlvblock_context *c)

{
  int iVar1;
  int iVar2;
  int oi;
  rfc5444_reader_tlvblock_context *c_local;
  
  iVar2 = c->consumer->order + -1;
  printf("%s: packet start (order %d): %d\n","cb_start_packet",(ulong)(uint)c->consumer->order,
         (ulong)(uint)callback_index);
  iVar1 = callback_index + 1;
  idxcb_start_packet[iVar2] = callback_index;
  callback_index = iVar1;
  return result_start_packet[iVar2];
}

Assistant:

static enum rfc5444_result
cb_start_packet(struct rfc5444_reader_tlvblock_context *c) {
  int oi = c->consumer->order - 1;

#ifdef PRINT_CB
  printf("%s: packet start (order %d): %d\n", __func__, c->consumer->order, callback_index);
#endif
  idxcb_start_packet[oi] = callback_index++;
  return result_start_packet[oi];
}